

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix-ops.cpp
# Opt level: O1

Mat * pobr::imgProcessing::utils::matrixOps::forEachPixel
                (Mat *img,function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *operation)

{
  unsigned_long local_30;
  unsigned_long local_28;
  
  local_28 = 0;
  if (*(int *)(img + 0xc) != 0) {
    do {
      local_30 = 0;
      if (*(int *)(img + 8) != 0) {
        do {
          if ((operation->super__Function_base)._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*operation->_M_invoker)((_Any_data *)operation,&local_28,&local_30);
          local_30 = local_30 + 1;
        } while (local_30 < (ulong)(long)*(int *)(img + 8));
      }
      local_28 = local_28 + 1;
    } while (local_28 < (ulong)(long)*(int *)(img + 0xc));
  }
  return img;
}

Assistant:

const cv::Mat&
matrixOps::forEachPixel(
    const cv::Mat& img,
    const std::function<void(const uint64_t& x, const uint64_t& y)>& operation
)
{
    for (uint64_t x = 0; x < img.cols; x++) {
        for (uint64_t y = 0; y < img.rows; y++) {
            operation(x, y);
        }
    }

    return img;
}